

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,dynbuf *req)

{
  connectdata *pcVar1;
  int iVar2;
  char cVar3;
  bool bVar4;
  char *local_98;
  char *compare;
  curl_slist *pcStack_70;
  CURLcode result;
  char *optr;
  char *semicolonp;
  int local_58;
  proxy_use proxy;
  int i;
  int numlists;
  curl_slist *headers;
  curl_slist *h [2];
  char *ptr;
  connectdata *conn;
  dynbuf *req_local;
  _Bool is_connect_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  proxy = HEADER_PROXY;
  if (is_connect) {
    cVar3 = '\x02';
  }
  else {
    cVar3 = '\0';
    if ((*(ulong *)&(pcVar1->bits).field_0x4 & 1) != 0) {
      cVar3 = (*(ulong *)&(pcVar1->bits).field_0x4 >> 3 & 1) == 0;
    }
  }
  if (((cVar3 != '\0') && (cVar3 == '\x01')) && ((*(ulong *)&(data->set).field_0x9a0 >> 4 & 1) != 0)
     ) {
    h[0] = (data->set).proxyheaders;
    proxy = HEADER_CONNECT;
  }
  local_58 = 0;
  do {
    if ((int)proxy <= local_58) {
      return CURLE_OK;
    }
    for (_i = h[(long)local_58 + -1]; _i != (curl_slist *)0x0; _i = _i->next) {
      optr = (char *)0x0;
      h[1] = (curl_slist *)strchr(_i->data,0x3a);
      if (h[1] == (curl_slist *)0x0) {
        pcStack_70 = (curl_slist *)strchr(_i->data,0x3b);
        h[1] = pcStack_70;
        if (pcStack_70 != (curl_slist *)0x0) {
          do {
            h[1] = (curl_slist *)((long)&h[1]->data + 1);
            bVar4 = false;
            if (*(char *)&h[1]->data != '\0') {
              iVar2 = Curl_isspace((uint)*(byte *)&h[1]->data);
              bVar4 = iVar2 != 0;
            }
          } while (bVar4);
          if (*(char *)&h[1]->data == '\0') {
            if (*(char *)((long)&h[1][-1].next + 7) == ';') {
              h[1] = (curl_slist *)((long)&h[1][-1].next + 7);
              optr = (*Curl_cstrdup)(_i->data);
              if (optr == (char *)0x0) {
                Curl_dyn_free(req);
                return CURLE_OUT_OF_MEMORY;
              }
              optr[(long)h[1] - (long)_i->data] = ':';
              pcStack_70 = (curl_slist *)(optr + ((long)h[1] - (long)_i->data));
            }
          }
          else {
            pcStack_70 = (curl_slist *)0x0;
          }
          h[1] = pcStack_70;
        }
      }
      if (h[1] != (curl_slist *)0x0) {
        h[1] = (curl_slist *)((long)&h[1]->data + 1);
        while( true ) {
          bVar4 = false;
          if (*(char *)&h[1]->data != '\0') {
            iVar2 = Curl_isspace((uint)*(byte *)&h[1]->data);
            bVar4 = iVar2 != 0;
          }
          if (!bVar4) break;
          h[1] = (curl_slist *)((long)&h[1]->data + 1);
        }
        if ((*(char *)&h[1]->data != '\0') || (optr != (char *)0x0)) {
          compare._4_4_ = CURLE_OK;
          if (optr == (char *)0x0) {
            local_98 = _i->data;
          }
          else {
            local_98 = optr;
          }
          if (((((((data->state).aptr.host == (char *)0x0) ||
                 (iVar2 = curl_strnequal("Host:",local_98,5), iVar2 == 0)) &&
                (((data->state).httpreq != HTTPREQ_POST_FORM ||
                 (iVar2 = curl_strnequal("Content-Type:",local_98,0xd), iVar2 == 0)))) &&
               ((((data->state).httpreq != HTTPREQ_POST_MIME ||
                 (iVar2 = curl_strnequal("Content-Type:",local_98,0xd), iVar2 == 0)) &&
                (((*(ulong *)&(pcVar1->bits).field_0x4 >> 0x11 & 1) == 0 ||
                 (iVar2 = curl_strnequal("Content-Length:",local_98,0xf), iVar2 == 0)))))) &&
              ((((data->state).aptr.te == (char *)0x0 ||
                (iVar2 = curl_strnequal("Connection:",local_98,0xb), iVar2 == 0)) &&
               ((pcVar1->httpversion < 0x14 ||
                (iVar2 = curl_strnequal("Transfer-Encoding:",local_98,0x12), iVar2 == 0)))))) &&
             (((((iVar2 = curl_strnequal("Authorization:",local_98,0xe), iVar2 == 0 &&
                 (iVar2 = curl_strnequal("Cookie:",local_98,7), iVar2 == 0)) ||
                ((*(uint *)&(data->state).field_0x660 >> 1 & 1) == 0)) ||
               (((data->state).first_host == (char *)0x0 ||
                ((*(ulong *)&(data->set).field_0x9a0 >> 0x18 & 1) != 0)))) ||
              (iVar2 = Curl_strcasecompare((data->state).first_host,(pcVar1->host).name), iVar2 != 0
              )))) {
            compare._4_4_ = Curl_dyn_addf(req,"%s\r\n",local_98);
          }
          if (optr != (char *)0x0) {
            (*Curl_cfree)(optr);
          }
          if (compare._4_4_ != CURLE_OK) {
            return compare._4_4_;
          }
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect,
#ifndef USE_HYPER
                                 struct dynbuf *req
#else
                                 void *req
#endif
  )
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
#ifndef USE_HYPER
                Curl_dyn_free(req);
#endif
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(data->state.aptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(data->state.aptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion >= 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  (data->state.this_is_a_follow &&
                   data->state.first_host &&
                   !data->set.allow_auth_to_other_hosts &&
                   !strcasecompare(data->state.first_host, conn->host.name)))
            ;
          else {
#ifdef USE_HYPER
            result = Curl_hyper_header(data, req, compare);
#else
            result = Curl_dyn_addf(req, "%s\r\n", compare);
#endif
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}